

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O3

IntrinsicResult MiniScript::intrinsic_remove(Context *context,IntrinsicResult partialResult)

{
  bool *pbVar1;
  long *plVar2;
  Context **ppCVar3;
  undefined1 uVar4;
  ListStorage<MiniScript::TACLine> *pLVar5;
  bool bVar6;
  uint uVar7;
  int32_t iVar8;
  int iVar9;
  Machine *pMVar10;
  Interpreter *pIVar11;
  long *plVar12;
  undefined2 *puVar13;
  char *pcVar14;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *pDVar15;
  anon_union_8_3_2f476f46_for_data *paVar16;
  HashMapEntry<MiniScript::Value,_MiniScript::Value> *pHVar17;
  HashMapEntry<MiniScript::Value,_MiniScript::Value> *pHVar18;
  _func_int **pp_Var19;
  long max;
  String *msg;
  undefined *min;
  anon_union_8_3_2f476f46_for_data aVar20;
  long lVar21;
  undefined *i;
  size_t __n;
  Value *pVVar22;
  HashMapEntry<MiniScript::Value,_MiniScript::Value> *this;
  long startPos;
  ValueDict selfMap;
  Value self;
  Value k;
  String selfStr;
  String substr;
  anon_union_8_3_2f476f46_for_data local_120;
  anon_union_8_3_2f476f46_for_data local_118;
  char local_110;
  undefined4 local_108;
  long *local_100;
  char local_f8;
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  String local_d0;
  Value local_c0;
  anon_union_8_3_2f476f46_for_data local_b0;
  anon_union_8_3_2f476f46_for_data local_a8;
  long *local_a0;
  anon_union_8_3_2f476f46_for_data local_98;
  undefined1 local_90 [16];
  Machine *local_80;
  anon_union_8_3_2f476f46_for_data local_78;
  Value local_70;
  ListStorage<MiniScript::Context_*> *local_60;
  anon_union_8_3_2f476f46_for_data local_58;
  Value local_50;
  Value local_40;
  
  local_78.tempNum._0_1_ = '\0';
  pMVar10 = (Machine *)operator_new(0x30);
  *(undefined8 *)&pMVar10->storeImplicit = 1;
  pMVar10->standardOutput = (TextOutputMethod)&PTR__StringStorage_001bf0d8;
  *(undefined8 *)&pMVar10->yielding = 5;
  (pMVar10->functionType).type = ~Null;
  (pMVar10->functionType).noInvoke = true;
  (pMVar10->functionType).localOnly = ~Off;
  *(undefined5 *)&(pMVar10->functionType).field_0x3 = 0xffffffffff;
  pIVar11 = (Interpreter *)operator_new__(5);
  pMVar10->interpreter = pIVar11;
  *(undefined1 *)((long)&pIVar11->_vptr_Interpreter + 4) = 0;
  *(undefined4 *)&pIVar11->_vptr_Interpreter = 0x666c6573;
  local_80 = pMVar10;
  Context::GetVar((Context *)local_f0,(String *)partialResult.rs,(LocalOnlyMode)&local_80);
  if ((local_80 != (Machine *)0x0) && (local_78.tempNum._0_1_ == '\0')) {
    pbVar1 = &local_80->storeImplicit;
    *(long *)pbVar1 = *(long *)pbVar1 + -1;
    if (*(long *)pbVar1 == 0) {
      (**(code **)(local_80->standardOutput + 8))();
    }
    local_80 = (Machine *)0x0;
  }
  local_98.tempNum._0_1_ = '\0';
  plVar12 = (long *)operator_new(0x30);
  plVar12[1] = 1;
  *plVar12 = (long)&PTR__StringStorage_001bf0d8;
  plVar12[3] = 2;
  plVar12[4] = -1;
  puVar13 = (undefined2 *)operator_new__(2);
  plVar12[2] = (long)puVar13;
  *puVar13 = 0x6b;
  local_a0 = plVar12;
  Context::GetVar((Context *)local_e0,(String *)partialResult.rs,(LocalOnlyMode)&local_a0);
  iVar9 = (int)partialResult.rs;
  if ((local_a0 != (long *)0x0) && (local_98.tempNum._0_1_ == '\0')) {
    plVar12 = local_a0 + 1;
    *plVar12 = *plVar12 + -1;
    if (*plVar12 == 0) {
      (**(code **)(*local_a0 + 8))();
    }
    local_a0 = (long *)0x0;
  }
  if (local_f0[0] == Null) {
    plVar12 = (long *)operator_new(0x30);
    plVar12[1] = 1;
    *plVar12 = (long)&PTR__StringStorage_001bf0d8;
    plVar12[3] = 0x26;
    plVar12[4] = -1;
    pcVar14 = (char *)operator_new__(0x26);
    plVar12[2] = (long)pcVar14;
    builtin_strncpy(pcVar14,"argument to \'remove\' must not be null",0x26);
    plVar12[1] = 2;
    local_118.number = 0.0;
    local_110 = '\0';
    local_108 = 0;
    local_f8 = '\0';
    local_120.ref = (RefCountedStorage *)&PTR__MiniscriptException_001bf310;
    local_100 = plVar12;
    RuntimeException::raise((RuntimeException *)&local_120,iVar9);
    local_120.number = (double)&PTR__MiniscriptException_001bf360;
    if ((local_100 != (long *)0x0) && (local_f8 == '\0')) {
      plVar2 = local_100 + 1;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (**(code **)(*local_100 + 8))();
      }
      local_100 = (long *)0x0;
    }
    if (((ListStorage<MiniScript::Value> *)local_118.ref != (ListStorage<MiniScript::Value> *)0x0)
       && (local_110 == '\0')) {
      plVar2 = &(local_118.ref)->refCount;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (*((RefCountedStorage *)&(local_118.ref)->_vptr_RefCountedStorage)->_vptr_RefCountedStorage
          [1])();
      }
      local_118.number = 0.0;
    }
    std::exception::~exception((exception *)&local_120);
    plVar2 = plVar12 + 1;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (**(code **)(*plVar12 + 8))(plVar12);
    }
  }
  if (local_f0[0] == String) {
    if (local_e0[0] == Null) {
      plVar12 = (long *)operator_new(0x30);
      plVar12[1] = 1;
      *plVar12 = (long)&PTR__StringStorage_001bf0d8;
      plVar12[3] = 0x26;
      plVar12[4] = -1;
      pcVar14 = (char *)operator_new__(0x26);
      plVar12[2] = (long)pcVar14;
      builtin_strncpy(pcVar14,"argument to \'remove\' must not be null",0x26);
      plVar12[1] = 2;
      local_118.number = 0.0;
      local_110 = '\0';
      local_108 = 0;
      local_f8 = '\0';
      local_120.ref = (RefCountedStorage *)&PTR__MiniscriptException_001bf310;
      local_100 = plVar12;
      RuntimeException::raise((RuntimeException *)&local_120,iVar9);
      local_120.number = (double)&PTR__MiniscriptException_001bf360;
      if ((local_100 != (long *)0x0) && (local_f8 == '\0')) {
        plVar2 = local_100 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*local_100 + 8))();
        }
        local_100 = (long *)0x0;
      }
      if (((ListStorage<MiniScript::Value> *)local_118.ref != (ListStorage<MiniScript::Value> *)0x0)
         && (local_110 == '\0')) {
        plVar2 = &(local_118.ref)->refCount;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (*((RefCountedStorage *)&(local_118.ref)->_vptr_RefCountedStorage)->
            _vptr_RefCountedStorage[1])();
        }
        local_118.number = 0.0;
      }
      std::exception::~exception((exception *)&local_120);
      plVar2 = plVar12 + 1;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (**(code **)(*plVar12 + 8))(plVar12);
      }
      if ((local_f0[0] & ~List) != String) {
        _Error("Assert failed: type == ValueType::String or type == ValueType::Var",
               "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/MiniscriptTypes.h"
               ,0x8f);
      }
    }
    if ((ListStorage<MiniScript::Value> *)local_f0._8_8_ != (ListStorage<MiniScript::Value> *)0x0) {
      *(long *)(local_f0._8_8_ + 8) = *(long *)(local_f0._8_8_ + 8) + 1;
    }
    local_b0.ref = (RefCountedStorage *)local_f0._8_8_;
    local_a8.tempNum._0_1_ = '\0';
    Value::ToString((Value *)&local_60,(Machine *)local_e0);
    if ((ListStorage<MiniScript::Value> *)local_b0.ref == (ListStorage<MiniScript::Value> *)0x0) {
LAB_0014bcec:
      local_70.type = local_f0[0];
      local_70.noInvoke = (bool)local_f0[1];
      local_70.localOnly = local_f0[2];
      local_70.data.ref = (RefCountedStorage *)local_f0._8_8_;
      if ((ListStorage<MiniScript::Value> *)local_f0._8_8_ != (ListStorage<MiniScript::Value> *)0x0
          && Temp < local_f0[0]) {
        *(long *)(local_f0._8_8_ + 8) = *(long *)(local_f0._8_8_ + 8) + 1;
      }
      (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
      IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).
                                 mBuf,&local_70);
      *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems =
           1;
      if ((Temp < local_70.type) &&
         ((ListStorage<MiniScript::Value> *)local_70.data.ref !=
          (ListStorage<MiniScript::Value> *)0x0)) {
        plVar12 = &(local_70.data.ref)->refCount;
        *plVar12 = *plVar12 + -1;
        if (*plVar12 == 0) {
          (*((RefCountedStorage *)&(local_70.data.ref)->_vptr_RefCountedStorage)->
            _vptr_RefCountedStorage[1])();
        }
        local_70.data.number = 0.0;
      }
    }
    else {
      if (local_60 != (ListStorage<MiniScript::Context_*> *)0x0) {
        ppCVar3 = (local_60->super_SimpleVector<MiniScript::Context_*>).mBuf;
        lVar21 = (long)local_b0.ref[1].refCount - (long)ppCVar3;
        if (-1 < lVar21) {
          __n = (long)ppCVar3 - 1;
          pp_Var19 = local_b0.ref[1]._vptr_RefCountedStorage;
          pcVar14 = (char *)(local_60->super_SimpleVector<MiniScript::Context_*>).mBlockItems;
          startPos = 0;
          do {
            iVar9 = strncmp((char *)(startPos + (long)pp_Var19),pcVar14,__n);
            if (iVar9 == 0) goto LAB_0014bf85;
            startPos = startPos + 1;
          } while (lVar21 + 1 != startPos);
        }
        goto LAB_0014bcec;
      }
      startPos = 0;
      __n = 0;
LAB_0014bf85:
      local_90._0_8_ = (StringStorage *)0x0;
      local_90[8] = '\0';
      paVar16 = (anon_union_8_3_2f476f46_for_data *)
                String::ReplaceB((String *)&local_b0,startPos,__n,(String *)local_90);
      local_c0.type = String;
      local_c0.noInvoke = false;
      local_c0.localOnly = Off;
      local_c0.data.ref = paVar16->ref;
      if (paVar16->ref == (RefCountedStorage *)0x0) {
        local_c0.data = DAT_001c1308;
      }
      if (local_c0.data.ref != (RefCountedStorage *)0x0) {
        (local_c0.data.ref)->refCount = (local_c0.data.ref)->refCount + 1;
      }
      (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
      IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).
                                 mBuf,&local_c0);
      *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems =
           1;
      if ((Temp < local_c0.type) && (local_c0.data.ref != (RefCountedStorage *)0x0)) {
        plVar12 = &(local_c0.data.ref)->refCount;
        *plVar12 = *plVar12 + -1;
        if (*plVar12 == 0) {
          (*(local_c0.data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_c0.data.number = 0.0;
      }
      if (((StringStorage *)local_90._0_8_ != (StringStorage *)0x0) && (local_90[8] == '\0')) {
        plVar12 = &((RefCountedStorage *)local_90._0_8_)->refCount;
        *plVar12 = *plVar12 + -1;
        if (*plVar12 == 0) {
          (*((RefCountedStorage *)local_90._0_8_)->_vptr_RefCountedStorage[1])();
        }
        local_90._0_8_ = (StringStorage *)0x0;
      }
    }
    aVar20 = local_b0;
    uVar4 = local_a8.tempNum._0_1_;
    if ((local_60 != (ListStorage<MiniScript::Context_*> *)0x0) && (local_58.tempNum._0_1_ == '\0'))
    {
      plVar12 = &(local_60->super_RefCountedStorage).refCount;
      *plVar12 = *plVar12 + -1;
      if (*plVar12 == 0) {
        (*(local_60->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        aVar20 = local_b0;
        uVar4 = local_a8.tempNum._0_1_;
      }
    }
joined_r0x0014c083:
    if ((ListStorage<MiniScript::Value> *)aVar20.ref == (ListStorage<MiniScript::Value> *)0x0)
    goto LAB_0014c0fc;
  }
  else {
    if (local_f0[0] != List) {
      if (local_f0[0] != Map) {
        local_d0.isTemp = false;
        pDVar15 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)operator_new(0x30);
        (pDVar15->super_RefCountedStorage).refCount = 1;
        (pDVar15->super_RefCountedStorage)._vptr_RefCountedStorage =
             (_func_int **)&PTR__StringStorage_001bf0d8;
        pDVar15->mTable[0] = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x33;
        pDVar15->mTable[1] =
             (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0xffffffffffffffff;
        pcVar14 = (char *)operator_new__(0x33);
        pDVar15->mSize = (long)pcVar14;
        msg = &local_d0;
        builtin_strncpy(pcVar14,"Type Error: \'remove\' requires map, list, or string",0x33);
        local_d0.ss = (StringStorage *)pDVar15;
        TypeException::TypeException((TypeException *)&local_120,msg);
        TypeException::raise((TypeException *)&local_120,(int)msg);
        local_120.number = (double)&PTR__MiniscriptException_001bf360;
        if ((local_100 != (long *)0x0) && (local_f8 == '\0')) {
          plVar12 = local_100 + 1;
          *plVar12 = *plVar12 + -1;
          if (*plVar12 == 0) {
            (**(code **)(*local_100 + 8))();
          }
          local_100 = (long *)0x0;
        }
        if (((ListStorage<MiniScript::Value> *)local_118.ref !=
             (ListStorage<MiniScript::Value> *)0x0) && (local_110 == '\0')) {
          plVar12 = &(local_118.ref)->refCount;
          *plVar12 = *plVar12 + -1;
          if (*plVar12 == 0) {
            (*((RefCountedStorage *)&(local_118.ref)->_vptr_RefCountedStorage)->
              _vptr_RefCountedStorage[1])();
          }
          local_118.number = 0.0;
        }
        std::exception::~exception((exception *)&local_120);
        if (((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_d0.ss !=
             (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
           (local_d0.isTemp == false)) {
          plVar12 = &((local_d0.ss)->super_RefCountedStorage).refCount;
          *plVar12 = *plVar12 + -1;
          if (*plVar12 == 0) {
            (*((local_d0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_d0.ss = (StringStorage *)0x0;
        }
        IntrinsicResult::ensureStorage((IntrinsicResult *)&IntrinsicResult::Null);
        pLVar5 = IntrinsicResult::Null;
        (context->code).ls = IntrinsicResult::Null;
        if (pLVar5 != (ListStorage<MiniScript::TACLine> *)0x0) {
          plVar12 = &(pLVar5->super_RefCountedStorage).refCount;
          *plVar12 = *plVar12 + 1;
        }
        goto LAB_0014c0fc;
      }
      Value::GetDict((ValueDict *)&local_120,(Value *)local_f0);
      if ((ListStorage<MiniScript::Value> *)local_118.ref == (ListStorage<MiniScript::Value> *)0x0)
      {
LAB_0014bebb:
        local_50.type = Value::zero;
        local_50.noInvoke = DAT_001c12e1;
        local_50.localOnly = DAT_001c12e2;
        local_50.data.ref = DAT_001c12e8;
        if (DAT_001c12e8 != (RefCountedStorage *)0x0 && 2 < Value::zero) {
          DAT_001c12e8->refCount = DAT_001c12e8->refCount + 1;
        }
        (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
        IntrinsicResult::ensureStorage((IntrinsicResult *)context);
        Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).
                                   mBuf,&local_50);
        *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems
             = 1;
        if ((2 < local_50.type) && (local_50.data.ref != (RefCountedStorage *)0x0)) {
          pVVar22 = &local_50;
          aVar20 = local_50.data;
LAB_0014bf42:
          plVar12 = &(aVar20.ref)->refCount;
          *plVar12 = *plVar12 + -1;
          if (*plVar12 == 0) {
            (*(aVar20.ref)->_vptr_RefCountedStorage[1])();
          }
          (pVVar22->data).number = 0.0;
        }
      }
      else {
        uVar7 = HashValue((Value *)local_e0);
        pVVar22 = (Value *)(&local_118.ref[1].refCount + uVar7 % 0xfb);
        do {
          pVVar22 = *(Value **)pVVar22;
          if (pVVar22 == (Value *)0x0) goto LAB_0014bebb;
          bVar6 = Value::operator==((Value *)&pVVar22->data,(Value *)local_e0);
        } while (!bVar6);
        if ((ListStorage<MiniScript::Value> *)local_118.ref != (ListStorage<MiniScript::Value> *)0x0
           ) {
          uVar7 = HashValue((Value *)local_e0);
          this = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)
                 (&local_118.ref[1].refCount + uVar7 % 0xfb);
          pHVar18 = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0;
          do {
            pHVar17 = pHVar18;
            this = this->next;
            if (this == (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0)
            goto LAB_0014b933;
            bVar6 = Value::operator==(&this->key,(Value *)local_e0);
            pHVar18 = this;
          } while (!bVar6);
          pHVar18 = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)
                    (&local_118.ref[1].refCount + uVar7 % 0xfb);
          if (pHVar17 != (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0) {
            pHVar18 = pHVar17;
          }
          pHVar18->next = this->next;
          this->next = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0;
          HashMapEntry<MiniScript::Value,_MiniScript::Value>::~HashMapEntry(this);
          operator_delete(this,0x28);
          local_118.ref[1]._vptr_RefCountedStorage =
               (_func_int **)((long)local_118.ref[1]._vptr_RefCountedStorage + -1);
        }
LAB_0014b933:
        local_40.type = Value::one;
        local_40.noInvoke = DAT_001c12f1;
        local_40.localOnly = DAT_001c12f2;
        local_40.data.ref = DAT_001c12f8;
        if (DAT_001c12f8 != (RefCountedStorage *)0x0 && Temp < Value::one) {
          DAT_001c12f8->refCount = DAT_001c12f8->refCount + 1;
        }
        (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
        IntrinsicResult::ensureStorage((IntrinsicResult *)context);
        Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).
                                   mBuf,&local_40);
        *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems
             = 1;
        if ((Temp < local_40.type) && (local_40.data.ref != (RefCountedStorage *)0x0)) {
          pVVar22 = &local_40;
          aVar20 = local_40.data;
          goto LAB_0014bf42;
        }
      }
      local_120.number = (double)&PTR__Dictionary_001bf240;
      aVar20 = local_118;
      uVar4 = local_110;
      goto joined_r0x0014c083;
    }
    if (local_e0[0] == Null) {
      plVar12 = (long *)operator_new(0x30);
      plVar12[1] = 1;
      *plVar12 = (long)&PTR__StringStorage_001bf0d8;
      plVar12[3] = 0x26;
      plVar12[4] = -1;
      pcVar14 = (char *)operator_new__(0x26);
      plVar12[2] = (long)pcVar14;
      builtin_strncpy(pcVar14,"argument to \'remove\' must not be null",0x26);
      plVar12[1] = 2;
      local_118.number = 0.0;
      local_110 = '\0';
      local_108 = 0;
      local_f8 = '\0';
      local_120.ref = (RefCountedStorage *)&PTR__MiniscriptException_001bf310;
      local_100 = plVar12;
      RuntimeException::raise((RuntimeException *)&local_120,iVar9);
      local_120.ref = (RefCountedStorage *)&PTR__MiniscriptException_001bf360;
      if ((local_100 != (long *)0x0) && (local_f8 == '\0')) {
        plVar2 = local_100 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*local_100 + 8))();
        }
        local_100 = (long *)0x0;
      }
      if (((ListStorage<MiniScript::Value> *)local_118.ref != (ListStorage<MiniScript::Value> *)0x0)
         && (local_110 == '\0')) {
        plVar2 = &(local_118.ref)->refCount;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (*((RefCountedStorage *)&(local_118.ref)->_vptr_RefCountedStorage)->
            _vptr_RefCountedStorage[1])();
        }
        local_118.number = 0.0;
      }
      std::exception::~exception((exception *)&local_120);
      plVar2 = plVar12 + 1;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (**(code **)(*plVar12 + 8))(plVar12);
      }
      if (local_f0[0] != List) {
        _Error("Assert failed: type == ValueType::List",
               "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/MiniscriptTypes.h"
               ,0x94);
      }
    }
    local_120.ref = (RefCountedStorage *)local_f0._8_8_;
    local_118.number = local_118.number & 0xffffffffffffff00;
    if ((ListStorage<MiniScript::Value> *)local_f0._8_8_ != (ListStorage<MiniScript::Value> *)0x0) {
      *(long *)(local_f0._8_8_ + 8) = *(long *)(local_f0._8_8_ + 8) + 1;
    }
    iVar8 = Value::IntValue((Value *)local_e0);
    i = (undefined *)(long)iVar8;
    if (iVar8 < 0) {
      if ((ListStorage<MiniScript::Value> *)local_120.ref == (ListStorage<MiniScript::Value> *)0x0)
      {
        pp_Var19 = (_func_int **)0x0;
      }
      else {
        pp_Var19 = local_120.ref[2]._vptr_RefCountedStorage;
      }
      i = (undefined *)((long)pp_Var19 + (long)i);
    }
    if ((ListStorage<MiniScript::Value> *)local_120.ref == (ListStorage<MiniScript::Value> *)0x0) {
      min = (undefined *)0xffffffffffffffff;
    }
    else {
      min = (undefined *)((long)local_120.ref[2]._vptr_RefCountedStorage + -1);
    }
    CheckRange((long)i,(long)min,max);
    List<MiniScript::Value>::RemoveAt((List<MiniScript::Value> *)&local_120,(long)i);
    IntrinsicResult::ensureStorage((IntrinsicResult *)&IntrinsicResult::Null);
    pLVar5 = IntrinsicResult::Null;
    (context->code).ls = IntrinsicResult::Null;
    if (pLVar5 != (ListStorage<MiniScript::TACLine> *)0x0) {
      plVar12 = &(pLVar5->super_RefCountedStorage).refCount;
      *plVar12 = *plVar12 + 1;
    }
    if ((ListStorage<MiniScript::Value> *)local_120.ref == (ListStorage<MiniScript::Value> *)0x0)
    goto LAB_0014c0fc;
    aVar20 = local_120;
    uVar4 = local_118._0_1_;
  }
  if (uVar4 == '\0') {
    plVar12 = &(aVar20.ref)->refCount;
    *plVar12 = *plVar12 + -1;
    if (*plVar12 == 0) {
      (*((RefCountedStorage *)&(aVar20.ref)->_vptr_RefCountedStorage)->_vptr_RefCountedStorage[1])()
      ;
    }
  }
LAB_0014c0fc:
  if ((Temp < local_e0[0]) && ((RefCountedStorage *)local_e0._8_8_ != (RefCountedStorage *)0x0)) {
    plVar12 = (long *)(local_e0._8_8_ + 8);
    *plVar12 = *plVar12 + -1;
    if (*plVar12 == 0) {
      (*(*(_func_int ***)local_e0._8_8_)[1])();
    }
  }
  if ((Temp < local_f0[0]) &&
     ((ListStorage<MiniScript::Value> *)local_f0._8_8_ != (ListStorage<MiniScript::Value> *)0x0)) {
    plVar12 = (long *)(local_f0._8_8_ + 8);
    *plVar12 = *plVar12 + -1;
    if (*plVar12 == 0) {
      (*((RefCountedStorage *)local_f0._8_8_)->_vptr_RefCountedStorage[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_remove(Context *context, IntrinsicResult partialResult) {
		Value self = context->GetVar("self");
		Value k = context->GetVar("k");
		if (self.IsNull()) RuntimeException("argument to 'remove' must not be null").raise();
		if (self.type == ValueType::Map) {
			ValueDict selfMap = self.GetDict();
			if (selfMap.ContainsKey(k)) {
				selfMap.Remove(k);
				return IntrinsicResult(Value::one);
			}
			return IntrinsicResult(Value::zero);
		} else if (self.type == ValueType::List) {
			if (k.IsNull()) RuntimeException("argument to 'remove' must not be null").raise();
			ValueList selfList = self.GetList();
			long idx = k.IntValue();
			if (idx < 0) idx += selfList.Count();
			CheckRange(idx, 0, selfList.Count()-1);
			selfList.RemoveAt(idx);
			return IntrinsicResult::Null;
		} else if (self.type == ValueType::String) {
			if (k.IsNull()) RuntimeException("argument to 'remove' must not be null").raise();
			String selfStr = self.GetString();
			String substr = k.ToString();
			long foundPosB = selfStr.IndexOfB(substr);
			if (foundPosB < 0) return IntrinsicResult(self);
			return IntrinsicResult(selfStr.ReplaceB(foundPosB, substr.LengthB(), String()));
		}
		TypeException("Type Error: 'remove' requires map, list, or string").raise();
		return IntrinsicResult::Null;
	}